

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

void __thiscall tf::Executor::_invoke(Executor *this,Worker *worker,Node *node)

{
  atomic<unsigned_long> *paVar1;
  Topology *pTVar2;
  Node *pNVar3;
  Semaphores *pSVar4;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  first;
  undefined8 *puVar5;
  size_t sVar6;
  Node *pNVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  _Var11;
  ulong uVar12;
  undefined8 uVar13;
  iterator __end1;
  int *piVar14;
  handle_t *work;
  atomic<unsigned_long> *paVar15;
  iterator __begin1;
  _Hash_node_base *p_Var16;
  undefined8 *puVar17;
  Node *cache;
  SmallVector<tf::Node_*,_2U> waiters;
  SmallVector<int,_2U> conds;
  Node *local_80;
  SmallVector<tf::Node_*,_2U> local_78;
  undefined1 local_50 [16];
  undefined1 *local_40;
  int local_38 [2];
  
  do {
    while( true ) {
      local_80 = (Node *)0x0;
      if ((node->_nstate & 0x20000000) != 0) break;
      pTVar2 = node->_topology;
      if ((pTVar2 != (Topology *)0x0) &&
         (((uint)(pTVar2->_estate).super___atomic_base<int>._M_i >> 0x1d & 1) != 0)) {
        pNVar3 = node->_parent;
        if (node->_parent != (Node *)0x0) goto LAB_001060a6;
        LOCK();
        paVar15 = &pTVar2->_join_counter;
        (paVar15->super___atomic_base<unsigned_long>)._M_i =
             (paVar15->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
        if ((paVar15->super___atomic_base<unsigned_long>)._M_i == 0) {
          _tear_down_topology(this,worker,node->_topology);
        }
        goto LAB_00106231;
      }
      pNVar3 = node->_parent;
      if ((pNVar3 == (Node *)0x0) ||
         (((uint)(pNVar3->_estate).super___atomic_base<int>._M_i >> 0x1d & 1) == 0)) {
        pSVar4 = (node->_semaphores)._M_t.
                 super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                 .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
        if ((pSVar4 != (Semaphores *)0x0) && (*(long *)pSVar4 != *(long *)&pSVar4->field_0x8)) {
          local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>
          .super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX =
               &local_78.super_SmallVectorImpl<tf::Node_*>.
                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
          local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>
          .super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
               local_50;
          local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>
          .super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
               local_78.super_SmallVectorImpl<tf::Node_*>.
               super_SmallVectorTemplateBase<tf::Node_*,_true>.
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
          bVar8 = Node::_acquire_all(node,&local_78);
          if (!bVar8) {
            _schedule<tf::Node**>
                      (this,worker,
                       (Node **)local_78.super_SmallVectorImpl<tf::Node_*>.
                                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                super_SmallVectorBase.BeginX,
                       (Node **)local_78.super_SmallVectorImpl<tf::Node_*>.
                                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                super_SmallVectorBase.EndX);
            if ((U *)local_78.super_SmallVectorImpl<tf::Node_*>.
                     super_SmallVectorTemplateBase<tf::Node_*,_true>.
                     super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX
                == &local_78.super_SmallVectorImpl<tf::Node_*>.
                    super_SmallVectorTemplateBase<tf::Node_*,_true>.
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
              return;
            }
            free(local_78.super_SmallVectorImpl<tf::Node_*>.
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX);
            return;
          }
          if ((U *)local_78.super_SmallVectorImpl<tf::Node_*>.
                   super_SmallVectorTemplateBase<tf::Node_*,_true>.
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX !=
              &local_78.super_SmallVectorImpl<tf::Node_*>.
               super_SmallVectorTemplateBase<tf::Node_*,_true>.
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
            free(local_78.super_SmallVectorImpl<tf::Node_*>.
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX);
          }
        }
        break;
      }
LAB_001060a6:
      node = pNVar3;
      uVar10 = node->_nstate;
      LOCK();
      paVar15 = &node->_join_counter;
      (paVar15->super___atomic_base<unsigned_long>)._M_i =
           (paVar15->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      if (((paVar15->super___atomic_base<unsigned_long>)._M_i != 0) || ((uVar10 & 0x20000000) == 0))
      {
LAB_00106231:
        node = local_80;
        if (local_80 == (Node *)0x0) {
          return;
        }
      }
    }
    local_50._0_8_ = local_38;
    local_40 = &stack0xffffffffffffffd0;
    uVar10 = (uint)*(__index_type *)
                    ((long)&(node->_handle).
                            super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    + 0x38);
    local_50._8_8_ = local_50._0_8_;
    if (7 < uVar10 - 1) goto LAB_0010624f;
    work = &node->_handle;
    switch(uVar10) {
    case 1:
      p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
      if (p_Var16 != (_Hash_node_base *)0x0) {
        do {
          (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
          p_Var16 = p_Var16->_M_nxt;
        } while (p_Var16 != (_Hash_node_base *)0x0);
        if (*(__index_type *)
             ((long)&(node->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             + 0x38) != '\x01') {
          work = (handle_t *)0x0;
        }
      }
      if (*(long *)((long)&(work->
                           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           ).
                           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   + 0x10) == 0) {
        uVar13 = std::__throw_bad_function_call();
        if ((U *)local_78.super_SmallVectorImpl<tf::Node_*>.
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX !=
            &local_78.super_SmallVectorImpl<tf::Node_*>.
             super_SmallVectorTemplateBase<tf::Node_*,_true>.
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
          free(local_78.super_SmallVectorImpl<tf::Node_*>.
               super_SmallVectorTemplateBase<tf::Node_*,_true>.
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX);
        }
        _Unwind_Resume(uVar13);
      }
      (**(code **)((long)&(work->
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          ).
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 0x18))(work);
      for (p_Var16 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        (*(code *)(p_Var16[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var16[1]._M_nxt,worker,node);
      }
      break;
    case 2:
      bVar9 = _invoke_runtime_task_impl(this,worker,node,(function<void_(tf::Runtime_&)> *)work);
      goto LAB_0010616f;
    case 3:
      bVar9 = _invoke_subflow_task(this,worker,node);
LAB_0010616f:
      bVar8 = true;
      if (bVar9 == false) break;
      goto LAB_00106418;
    case 4:
      _invoke_condition_task(this,worker,node,(SmallVector<int,_2U> *)local_50);
      break;
    case 5:
      _invoke_multi_condition_task(this,worker,node,(SmallVector<int,_2U> *)local_50);
      break;
    case 6:
      puVar17 = *(undefined8 **)
                 &(work->
                  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  ).
                  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ;
      first._M_current = (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)*puVar17;
      _Var11._M_current = (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)puVar17[1];
      if (first._M_current != _Var11._M_current) {
        uVar10 = node->_nstate;
        if ((uVar10 >> 0x1d & 1) == 0) {
          node->_nstate = uVar10 | 0x20000000;
          _Var11 = _set_up_graph<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                             (this,first,_Var11,node->_topology,node);
          LOCK();
          (node->_join_counter).super___atomic_base<unsigned_long>._M_i =
               (node->_join_counter).super___atomic_base<unsigned_long>._M_i +
               ((long)_Var11._M_current - (long)first._M_current >> 3);
          UNLOCK();
          bVar8 = true;
          _schedule<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                    (this,worker,first,_Var11);
          goto LAB_00106418;
        }
        node->_nstate = uVar10 & 0xdfffffff;
      }
      break;
    case 7:
      bVar9 = _invoke_async_task(this,worker,node);
      bVar8 = true;
      if (bVar9) goto LAB_00106418;
      _tear_down_async(this,worker,node,&local_80);
      pNVar3 = local_80;
      goto LAB_00106408;
    case 8:
      bVar9 = _invoke_dependent_async_task(this,worker,node);
      bVar8 = true;
      if (!bVar9) {
        _tear_down_dependent_async(this,worker,node,&local_80);
        pNVar3 = local_80;
        goto LAB_00106408;
      }
      goto LAB_00106418;
    }
LAB_0010624f:
    pSVar4 = (node->_semaphores)._M_t.
             super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
             ._M_t.
             super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
             .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
    if (pSVar4 != (Semaphores *)0x0) {
      puVar17 = *(undefined8 **)&pSVar4->to_release;
      puVar5 = *(undefined8 **)&pSVar4->field_0x30;
      if (puVar17 != puVar5) {
        local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX =
             &local_78.super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
        local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX = local_50
        ;
        local_78.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
             local_78.super_SmallVectorImpl<tf::Node_*>.
             super_SmallVectorTemplateBase<tf::Node_*,_true>.
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        do {
          Semaphore::_release((Semaphore *)*puVar17,&local_78);
          puVar17 = puVar17 + 1;
        } while (puVar17 != puVar5);
        _schedule<tf::Node**>
                  (this,worker,
                   (Node **)local_78.super_SmallVectorImpl<tf::Node_*>.
                            super_SmallVectorTemplateBase<tf::Node_*,_true>.
                            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                            BeginX,
                   (Node **)local_78.super_SmallVectorImpl<tf::Node_*>.
                            super_SmallVectorTemplateBase<tf::Node_*,_true>.
                            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                            EndX);
        if ((U *)local_78.super_SmallVectorImpl<tf::Node_*>.
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX !=
            &local_78.super_SmallVectorImpl<tf::Node_*>.
             super_SmallVectorTemplateBase<tf::Node_*,_true>.
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
          free(local_78.super_SmallVectorImpl<tf::Node_*>.
               super_SmallVectorTemplateBase<tf::Node_*,_true>.
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX);
        }
      }
    }
    uVar13 = local_50._8_8_;
    sVar6 = node->_num_successors;
    LOCK();
    (node->_join_counter).super___atomic_base<unsigned_long>._M_i =
         (node->_join_counter).super___atomic_base<unsigned_long>._M_i +
         (((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
           (long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX >> 3
          ) - ((node->_nstate & 0xfffffff) + sVar6));
    UNLOCK();
    if (node->_parent == (Node *)0x0) {
      paVar15 = &node->_topology->_join_counter;
    }
    else {
      paVar15 = &node->_parent->_join_counter;
    }
    piVar14 = (int *)local_50._0_8_;
    if ((*(__index_type *)
          ((long)&(node->_handle).
                  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          + 0x38) & 0xfe) == 4) {
      for (; piVar14 != (int *)uVar13; piVar14 = piVar14 + 1) {
        uVar12 = (ulong)*piVar14;
        pNVar3 = local_80;
        if ((-1 < (long)uVar12) && (uVar12 < node->_num_successors)) {
          pNVar3 = *(Node **)((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                                    super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                    super_SmallVectorBase.BeginX + uVar12 * 8);
          (pNVar3->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
          LOCK();
          (paVar15->super___atomic_base<unsigned_long>)._M_i =
               (paVar15->super___atomic_base<unsigned_long>)._M_i + 1;
          UNLOCK();
          if (local_80 != (Node *)0x0) {
            _schedule(this,worker,local_80);
          }
        }
        local_80 = pNVar3;
      }
    }
    else if (sVar6 != 0) {
      uVar12 = 0;
      do {
        pNVar3 = *(Node **)((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                                  super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                  super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                  super_SmallVectorBase.BeginX + uVar12 * 8);
        LOCK();
        paVar1 = &pNVar3->_join_counter;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
        pNVar7 = local_80;
        if ((paVar1->super___atomic_base<unsigned_long>)._M_i == 0) {
          LOCK();
          (paVar15->super___atomic_base<unsigned_long>)._M_i =
               (paVar15->super___atomic_base<unsigned_long>)._M_i + 1;
          UNLOCK();
          pNVar7 = pNVar3;
          if (local_80 != (Node *)0x0) {
            _schedule(this,worker,local_80);
          }
        }
        local_80 = pNVar7;
        uVar12 = uVar12 + 1;
      } while (uVar12 < node->_num_successors);
    }
    pNVar7 = node->_parent;
    pNVar3 = local_80;
    if (pNVar7 == (Node *)0x0) {
      LOCK();
      paVar15 = &node->_topology->_join_counter;
      (paVar15->super___atomic_base<unsigned_long>)._M_i =
           (paVar15->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      if ((paVar15->super___atomic_base<unsigned_long>)._M_i == 0) {
        _tear_down_topology(this,worker,node->_topology);
        pNVar3 = local_80;
      }
    }
    else {
      uVar10 = pNVar7->_nstate;
      LOCK();
      paVar15 = &pNVar7->_join_counter;
      (paVar15->super___atomic_base<unsigned_long>)._M_i =
           (paVar15->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      if ((((paVar15->super___atomic_base<unsigned_long>)._M_i == 0) && ((uVar10 & 0x20000000) != 0)
          ) && (pNVar3 = pNVar7, local_80 != (Node *)0x0)) {
        _schedule(this,worker,local_80);
      }
    }
LAB_00106408:
    local_80 = pNVar3;
    bVar8 = local_80 == (Node *)0x0;
    if (!bVar8) {
      node = local_80;
    }
LAB_00106418:
    if ((int *)local_50._0_8_ != local_38) {
      free((void *)local_50._0_8_);
    }
    if (bVar8) {
      return;
    }
  } while( true );
}

Assistant:

inline void Executor::_invoke(Worker& worker, Node* node) {

  #define TF_INVOKE_CONTINUATION()  \
  if (cache) {                      \
    node = cache;                   \
    goto begin_invoke;              \
  }

  begin_invoke:

  Node* cache {nullptr};
  
  // if this is the second invoke due to preemption, directly jump to invoke task
  if(node->_nstate & NSTATE::PREEMPTED) {
    goto invoke_task;
  }

  // if the work has been cancelled, there is no need to continue
  if(node->_is_cancelled()) {
    _tear_down_invoke(worker, node, cache);
    TF_INVOKE_CONTINUATION();
    return;
  }

  // if acquiring semaphore(s) exists, acquire them first
  if(node->_semaphores && !node->_semaphores->to_acquire.empty()) {
    SmallVector<Node*> waiters;
    if(!node->_acquire_all(waiters)) {
      _schedule(worker, waiters.begin(), waiters.end());
      return;
    }
  }
  
  invoke_task:
  
  SmallVector<int> conds;

  // switch is faster than nested if-else due to jump table
  switch(node->_handle.index()) {
    // static task
    case Node::STATIC:{
      _invoke_static_task(worker, node);
    }
    break;
    
    // runtime task
    case Node::RUNTIME:{
      if(_invoke_runtime_task(worker, node)) {
        return;
      }
    }
    break;

    // subflow task
    case Node::SUBFLOW: {
      if(_invoke_subflow_task(worker, node)) {
        return;
      }
    }
    break;

    // condition task
    case Node::CONDITION: {
      _invoke_condition_task(worker, node, conds);
    }
    break;

    // multi-condition task
    case Node::MULTI_CONDITION: {
      _invoke_multi_condition_task(worker, node, conds);
    }
    break;

    // module task
    case Node::MODULE: {
      if(_invoke_module_task(worker, node)) {
        return;
      }
    }
    break;

    // async task
    case Node::ASYNC: {
      if(_invoke_async_task(worker, node)) {
        return;
      }
      _tear_down_async(worker, node, cache);
      TF_INVOKE_CONTINUATION();
      return;
    }
    break;

    // dependent async task
    case Node::DEPENDENT_ASYNC: {
      if(_invoke_dependent_async_task(worker, node)) {
        return;
      }
      _tear_down_dependent_async(worker, node, cache);
      TF_INVOKE_CONTINUATION();
      return;
    }
    break;

    // monostate (placeholder)
    default:
    break;
  }

  // if releasing semaphores exist, release them
  if(node->_semaphores && !node->_semaphores->to_release.empty()) {
    SmallVector<Node*> waiters;
    node->_release_all(waiters);
    _schedule(worker, waiters.begin(), waiters.end());
  }

  // Reset the join counter with strong dependencies to support cycles.
  // + We must do this before scheduling the successors to avoid race
  //   condition on _predecessors.
  // + We must use fetch_add instead of direct assigning
  //   because the user-space call on "invoke" may explicitly schedule 
  //   this task again (e.g., pipeline) which can access the join_counter.
  node->_join_counter.fetch_add(
    node->num_predecessors() - (node->_nstate & ~NSTATE::MASK), std::memory_order_relaxed
  );

  // acquire the parent flow counter
  auto& join_counter = (node->_parent) ? node->_parent->_join_counter :
                       node->_topology->_join_counter;

  // Invoke the task based on the corresponding type
  switch(node->_handle.index()) {

    // condition and multi-condition tasks
    case Node::CONDITION:
    case Node::MULTI_CONDITION: {
      for(auto cond : conds) {
        if(cond >= 0 && static_cast<size_t>(cond) < node->_num_successors) {
          auto s = node->_edges[cond]; 
          // zeroing the join counter for invariant
          s->_join_counter.store(0, std::memory_order_relaxed);
          join_counter.fetch_add(1, std::memory_order_relaxed);
          _update_cache(worker, cache, s);
        }
      }
    }
    break;

    // non-condition task
    default: {
      for(size_t i=0; i<node->_num_successors; ++i) {
        //if(auto s = node->_successors[i]; --(s->_join_counter) == 0) {
        if(auto s = node->_edges[i]; s->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
          join_counter.fetch_add(1, std::memory_order_relaxed);
          _update_cache(worker, cache, s);
        }
      }
    }
    break;
  }
  
  // clean up the node after execution
  _tear_down_invoke(worker, node, cache);
  TF_INVOKE_CONTINUATION();
}